

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall miniros::Connection::drop(Connection *this,DropReason reason)

{
  DropWatchers *this_00;
  Connection *pCVar1;
  Connection *pCVar2;
  scoped_lock<miniros::observer::Target<miniros::Connection::DropWatcher>_> lock;
  string local_50;
  
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (drop::loc.initialized_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"miniros.connection",(allocator<char> *)&lock);
    console::initializeLogLocation(&drop::loc,&local_50,Debug);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (drop::loc.level_ != Debug) {
    console::setLogLocationLevel(&drop::loc,Debug);
    console::checkLogLocationEnabled(&drop::loc);
  }
  if (drop::loc.logger_enabled_ == true) {
    console::print((FilterBase *)0x0,drop::loc.logger_,drop::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/connection.cpp"
                   ,0x158,"void miniros::Connection::drop(DropReason)","Connection::drop(%u)",
                   (ulong)reason);
  }
  if (((this->dropped_)._M_base._M_i & 1U) == 0) {
    LOCK();
    (this->dropped_)._M_base._M_i = true;
    UNLOCK();
    this_00 = &this->drop_watchers_;
    lock._M_device = this_00;
    observer::TargetBase::lock(&this_00->super_TargetBase);
    pCVar1 = observer::TargetBase::objBegin(&this_00->super_TargetBase);
    while( true ) {
      pCVar2 = observer::TargetBase::objEnd(&this_00->super_TargetBase);
      if ((pCVar1 == (Connection *)0x0) || (pCVar1 == pCVar2)) break;
      std::__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<miniros::Connection,void>
                ((__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2> *)&local_50,
                 (__weak_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2> *)this);
      (*pCVar1->_vptr_Connection[2])(pCVar1,&local_50,(ulong)reason);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
      pCVar1 = pCVar1->m_next;
    }
    std::scoped_lock<miniros::observer::Target<miniros::Connection::DropWatcher>_>::~scoped_lock
              (&lock);
    (*((this->transport_).super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_Transport[8])();
  }
  return;
}

Assistant:

void Connection::drop(DropReason reason)
{
  MINIROS_DEBUG("Connection::drop(%u)", reason);
  bool did_drop = false;
  {
    if (!dropped_)
    {
      dropped_ = true;
      did_drop = true;
    }
  }

  if (did_drop)
  {
    {
        std::scoped_lock<DropWatchers> lock(drop_watchers_);
        for (auto it = drop_watchers_.begin(); it != drop_watchers_.end(); it++)
        {
            if (!it)
              break;
            it->onConnectionDropped(shared_from_this(), reason);
        }
    }
    transport_->close();
  }
}